

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

bool helics::BrokerFactory::registerBroker(shared_ptr<helics::Broker> *broker,CoreType type)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  string local_78;
  __shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> local_38;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  
  peVar1 = (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
  }
  else {
    iVar3 = (*peVar1->_vptr_Broker[0xb])();
    std::__cxx11::string::string
              ((string *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(extraout_var,iVar3));
    if ((broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,&broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>);
      bVar2 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::addObject
                        ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)
                         searchableBrokers,&local_78,(shared_ptr<helics::Broker> *)&local_38,type);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_refcount);
      if ((broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
          (element_type *)0x0 && !bVar2) {
        local_28.__r = 100;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_28);
        cleanUpBrokers((milliseconds)0xc8);
        std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_48,&broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>
                  );
        bVar2 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::
                addObject((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)
                          searchableBrokers,&local_78,(shared_ptr<helics::Broker> *)&local_48,type);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_refcount);
      }
      if (bVar2 != false) {
        std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_58,&broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>
                  );
        gmlc::concurrency::DelayedDestructor<helics::Broker>::addObjectsToBeDestroyed
                  ((DelayedDestructor<helics::Broker> *)delayedDestroyer,
                   (shared_ptr<helics::Broker> *)&local_58);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_refcount);
        bVar2 = true;
        addExtraTypes(&local_78,type);
        goto LAB_00239284;
      }
    }
  }
  bVar2 = false;
LAB_00239284:
  std::__cxx11::string::~string((string *)&local_78);
  return bVar2;
}

Assistant:

bool registerBroker(const std::shared_ptr<Broker>& broker, CoreType type)
{
    bool registered = false;
    const std::string& bname = (broker) ? broker->getIdentifier() : std::string{};
    if (broker) {
        registered = searchableBrokers.addObject(bname, broker, type);
    }
    if ((!registered) && (broker)) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        cleanUpBrokers(std::chrono::milliseconds(200));
        registered = searchableBrokers.addObject(bname, broker, type);
    }
    if (registered) {
        delayedDestroyer.addObjectsToBeDestroyed(broker);
        addExtraTypes(bname, type);
    }

    return registered;
}